

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf16_inverse.cpp
# Opt level: O1

int main(void)

{
  pointer psVar1;
  undefined8 uVar2;
  ostream *poVar3;
  static_truth_table<4U,_true> *extraout_RDX;
  static_truth_table<4U,_true> *extraout_RDX_00;
  static_truth_table<4U,_true> *func;
  long lVar4;
  cube *cube;
  pointer pcVar5;
  uint i;
  uint uVar6;
  long *plVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<kitty::static_truth_table<4U,_true>_> __l_00;
  anon_class_16_2_3a34d4c8 __f;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  y;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  steps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chain;
  vector<kitty::cube,_std::allocator<kitty::cube>_> cubes;
  allocator_type local_2d0;
  undefined7 uStack_2cf;
  long local_2c8;
  long local_2c0 [2];
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  local_2b0;
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  local_298;
  long local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_258._0_8_ = local_258 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"x5 = x3 ^ x4","");
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"x6 = x1 & x3","");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"x7 = x2 ^ x6","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"x8 = x1 ^ x2","");
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"x9 = x4 ^ x6","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"x10 = x8 & x9","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"x11 = x5 & x7","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"x12 = x1 & x4","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x13 = x8 & x12","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"x14 = x8 ^ x13","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"x15 = x2 & x3","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"x16 = x5 & x15","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"x17 = x5 ^ x16","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"x18 = x6 ^ x17","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"x19 = x4 ^ x11","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"x20 = x6 ^ x14","");
  plVar7 = local_48;
  local_58[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"x21 = x2 ^ x10","");
  __l._M_len = 0x11;
  __l._M_array = (iterator)local_258;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_270,__l,&local_2d0);
  lVar4 = -0x220;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  local_298.
  super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kitty::create_multiple_from_chain<kitty::static_truth_table<4u,true>,void>
            (4,&local_298,&local_270,(string *)0x0);
  local_258._0_8_ =
       local_298.
       super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0x11]._bits;
  local_258._8_8_ =
       local_298.
       super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0x12]._bits;
  local_248._M_allocated_capacity =
       local_298.
       super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0x13]._bits;
  local_248._8_8_ =
       local_298.
       super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start[0x14]._bits;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_258;
  std::
  vector<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
  ::vector(&local_2b0,__l_00,(allocator_type *)&local_2d0);
  lVar4 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y",1);
    local_278 = lVar4 + 1;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    psVar1 = local_2b0.
             super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::stringstream::stringstream((stringstream *)local_258);
    __f.chunk_size = 4;
    __f.os = (ostream *)(local_258 + 0x10);
    std::
    for_each<unsigned_long_const*,kitty::print_hex<kitty::static_truth_table<4u,true>,void>(kitty::static_truth_table<4u,true>const&,std::ostream&)::_lambda(auto:1)_1_>
              (&psVar1[lVar4]._bits,&psVar1[lVar4 + 1]._bits,__f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_258);
    std::ios_base::~ios_base((ios_base *)local_1d8);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT71(uStack_2cf,local_2d0),local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    func = extraout_RDX;
    if ((long *)CONCAT71(uStack_2cf,local_2d0) != local_2c0) {
      operator_delete((long *)CONCAT71(uStack_2cf,local_2d0),local_2c0[0] + 1);
      func = extraout_RDX_00;
    }
    kitty::esop_from_pprm<kitty::static_truth_table<4u,true>>
              ((vector<kitty::cube,_std::allocator<kitty::cube>_> *)local_258,
               (kitty *)(local_2b0.
                         super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4),func);
    uVar2 = local_258._8_8_;
    for (pcVar5 = (pointer)local_258._0_8_; pcVar5 != (pointer)uVar2; pcVar5 = pcVar5 + 1) {
      uVar6 = 0;
      do {
        local_2d0 = (allocator_type)
                    (((pcVar5->field_0).field_0._bits >> (uVar6 & 0x1f) & 1) == 0 ^ 0x31);
        if (((pcVar5->field_0).field_0._mask >> (uVar6 & 0x1f) & 1) == 0) {
          local_2d0 = (allocator_type)0x2d;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_2d0,1);
        uVar6 = uVar6 + 1;
      } while (uVar6 != 4);
      local_2d0 = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_2d0,1)
      ;
    }
    std::ostream::flush();
    if ((pointer)local_258._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity - local_258._0_8_);
    }
    lVar4 = local_278;
  } while (local_278 != 4);
  std::ostream::flush();
  if (local_2b0.
      super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b0.
                    super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b0.
                          super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b0.
                          super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.
      super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<kitty::static_truth_table<4U,_true>,_std::allocator<kitty::static_truth_table<4U,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270);
  return 0;
}

Assistant:

int main()
{
  /* This is the Boolean chain described in Fig. 1 of [J. Boyar and R. Peralta,
     SEC (2012), 287-298] */
  std::vector<std::string> chain{
      "x5 = x3 ^ x4", "x6 = x1 & x3", "x7 = x2 ^ x6",
      "x8 = x1 ^ x2", "x9 = x4 ^ x6", "x10 = x8 & x9",
      "x11 = x5 & x7", "x12 = x1 & x4", "x13 = x8 & x12",
      "x14 = x8 ^ x13", "x15 = x2 & x3", "x16 = x5 & x15",
      "x17 = x5 ^ x16", "x18 = x6 ^ x17", "x19 = x4 ^ x11",
      "x20 = x6 ^ x14", "x21 = x2 ^ x10"};

  /* create truth tables */
  std::vector<kitty::static_truth_table<4>> steps;
  kitty::create_multiple_from_chain( 4, steps, chain );

  /* output functions are in the last four steps */
  std::vector<kitty::static_truth_table<4>> y{steps[17], steps[18], steps[19], steps[20]};

  /* for each output ... */
  for ( auto i = 0; i < 4; ++i )
  {
    /* print hex representation of function */
    std::cout << "y" << ( i + 1 ) << " = " << kitty::to_hex( y[i] ) << "\n";

    /* print PPRM (algebraic normal form) as in Sect. 3 of the above cited
       paper */
    const auto cubes = esop_from_pprm( y[i] );
    kitty::print_cubes( cubes, 4 );
  }

  std::cout << std::flush;
}